

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADB.cpp
# Opt level: O1

uint8_t __thiscall Apple::IIgs::ADB::GLU::get_mouse_data(GLU *this)

{
  uint8_t uVar1;
  uint uVar2;
  
  uVar2 = this->visible_mouse_register_;
  uVar1 = this->registers_[(int)uVar2];
  if ((long)(int)uVar2 == 3) {
    this->status_ = this->status_ & 0x7f;
  }
  this->visible_mouse_register_ = uVar2 ^ 1;
  return uVar1;
}

Assistant:

uint8_t GLU::get_mouse_data() {
	// Alternates between returning x and y values.
	//
	// b7:		1 = button is up; 0 = button is down.
	// b6:		delta sign bit; 1 = negative.
	// b5–b0:	mouse delta.

	const uint8_t result = registers_[visible_mouse_register_];
	if(visible_mouse_register_ == 3) {
		status_ &= ~uint8_t(CPUFlags::MouseDataFull);
	}

	// Spelt out at tedious length because Clang has trust issues.
	static constexpr int first_register = 2;
	static constexpr int second_register = 3;
	static constexpr int flip_mask = first_register ^ second_register;
	visible_mouse_register_ ^= flip_mask;
	return result;
}